

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkCollectDfs_rec(Cba_Ntk_t *p,int iObj,Vec_Int_t *vObjs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint nSize;
  char *__assertion;
  ulong uVar4;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    if (0 < (p->vObjCopy).nSize) {
      nSize = iObj + 1;
      Vec_IntFillExtra(&p->vObjCopy,nSize,-1);
      if (iObj < (p->vObjCopy).nSize) {
        if ((p->vObjCopy).pArray[(uint)iObj] == 0) {
          return;
        }
        Cba_ObjSetCopy(p,iObj,0);
        uVar3 = (p->vObjFin0).nSize;
        if ((iObj < (int)uVar3) && (nSize < uVar3)) {
          uVar1 = (p->vObjFin0).pArray[(uint)iObj];
          uVar4 = (ulong)uVar1;
          do {
            if ((p->vObjFin0).pArray[nSize] <= (int)uVar4) {
              Vec_IntPush(vObjs,iObj);
              return;
            }
            if ((int)uVar1 < 1) {
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if ((p->vFinFon).nSize <= (int)uVar4) break;
            iVar2 = (p->vFinFon).pArray[uVar4];
            if (0 < (long)iVar2) {
              if ((p->vFonObj).nSize <= iVar2) break;
              iVar2 = (p->vFonObj).pArray[iVar2];
              if (iVar2 != 0) {
                Cba_NtkCollectDfs_rec(p,iVar2,vObjs);
                uVar3 = (p->vObjFin0).nSize;
              }
            }
            uVar4 = uVar4 + 1;
          } while ((int)nSize < (int)uVar3);
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    __assertion = "Cba_NtkHasObjCopies(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0xee,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
}

Assistant:

void Cba_NtkCollectDfs_rec( Cba_Ntk_t * p, int iObj, Vec_Int_t * vObjs )
{
    int iFin, iFanin, k;
    if ( !Cba_ObjCopy(p, iObj) )
        return;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Vec_IntPush( vObjs, iObj );
}